

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::sPolynomial24
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x6eb];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x8a7];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x178] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x717] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8d3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x1a4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x743] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8ff] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x1d0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x76f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x92b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x304] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8a3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x957] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x330] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8cf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x983] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x927];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x35c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8fb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9af] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x388] =
       dVar3 / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9db] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x3b4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x953] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x3e0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x97f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x40c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9ab] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x438] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9d7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa07] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x464] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa03] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x6f8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb3b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x724] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb67] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x750] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb93] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x77c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbbf] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8b0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb37] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbeb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8dc] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb63] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc17] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x908] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc43] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x934] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbbb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc6f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x960] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe7] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x98c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc13] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9b8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9e4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc6b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc9b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa10] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc97] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb44] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcc7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb70] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcf3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb9c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd1f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbc8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd4b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbf4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcc3] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc20] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcef] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc4c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd1b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc78] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd47] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd77] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xca4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd73] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd54] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xda3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd80] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9f] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial24( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(24,8) = (groebnerMatrix(11,41)/(groebnerMatrix(11,40))-groebnerMatrix(15,51)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,9) = (groebnerMatrix(11,42)/(groebnerMatrix(11,40))-groebnerMatrix(15,52)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,10) = (groebnerMatrix(11,43)/(groebnerMatrix(11,40))-groebnerMatrix(15,53)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,17) = (groebnerMatrix(11,50)/(groebnerMatrix(11,40))-groebnerMatrix(15,54)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,18) = (groebnerMatrix(11,51)/(groebnerMatrix(11,40))-groebnerMatrix(15,55)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,19) = (groebnerMatrix(11,52)/(groebnerMatrix(11,40))-groebnerMatrix(15,56)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,20) = (groebnerMatrix(11,53)/(groebnerMatrix(11,40))-groebnerMatrix(15,57)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,21) = groebnerMatrix(11,54)/(groebnerMatrix(11,40));
  groebnerMatrix(24,22) = groebnerMatrix(11,55)/(groebnerMatrix(11,40));
  groebnerMatrix(24,23) = groebnerMatrix(11,56)/(groebnerMatrix(11,40));
  groebnerMatrix(24,24) = (groebnerMatrix(11,57)/(groebnerMatrix(11,40))-groebnerMatrix(15,58)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,25) = groebnerMatrix(11,58)/(groebnerMatrix(11,40));
  groebnerMatrix(24,40) = -groebnerMatrix(15,65)/(groebnerMatrix(15,50));
  groebnerMatrix(24,41) = -groebnerMatrix(15,66)/(groebnerMatrix(15,50));
  groebnerMatrix(24,42) = -groebnerMatrix(15,67)/(groebnerMatrix(15,50));
  groebnerMatrix(24,43) = -groebnerMatrix(15,68)/(groebnerMatrix(15,50));
  groebnerMatrix(24,50) = (groebnerMatrix(11,65)/(groebnerMatrix(11,40))-groebnerMatrix(15,69)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,51) = (groebnerMatrix(11,66)/(groebnerMatrix(11,40))-groebnerMatrix(15,70)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,52) = (groebnerMatrix(11,67)/(groebnerMatrix(11,40))-groebnerMatrix(15,71)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,53) = (groebnerMatrix(11,68)/(groebnerMatrix(11,40))-groebnerMatrix(15,72)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,54) = groebnerMatrix(11,69)/(groebnerMatrix(11,40));
  groebnerMatrix(24,55) = groebnerMatrix(11,70)/(groebnerMatrix(11,40));
  groebnerMatrix(24,56) = groebnerMatrix(11,71)/(groebnerMatrix(11,40));
  groebnerMatrix(24,57) = (groebnerMatrix(11,72)/(groebnerMatrix(11,40))-groebnerMatrix(15,73)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,58) = groebnerMatrix(11,73)/(groebnerMatrix(11,40));
  groebnerMatrix(24,65) = -groebnerMatrix(15,74)/(groebnerMatrix(15,50));
  groebnerMatrix(24,66) = -groebnerMatrix(15,75)/(groebnerMatrix(15,50));
  groebnerMatrix(24,67) = -groebnerMatrix(15,76)/(groebnerMatrix(15,50));
  groebnerMatrix(24,68) = -groebnerMatrix(15,77)/(groebnerMatrix(15,50));
  groebnerMatrix(24,69) = groebnerMatrix(11,74)/(groebnerMatrix(11,40));
  groebnerMatrix(24,70) = groebnerMatrix(11,75)/(groebnerMatrix(11,40));
  groebnerMatrix(24,71) = groebnerMatrix(11,76)/(groebnerMatrix(11,40));
  groebnerMatrix(24,72) = (groebnerMatrix(11,77)/(groebnerMatrix(11,40))-groebnerMatrix(15,78)/(groebnerMatrix(15,50)));
  groebnerMatrix(24,73) = groebnerMatrix(11,78)/(groebnerMatrix(11,40));
  groebnerMatrix(24,77) = -groebnerMatrix(15,79)/(groebnerMatrix(15,50));
  groebnerMatrix(24,78) = groebnerMatrix(11,79)/(groebnerMatrix(11,40));
}